

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_curves.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  test_curve *tc;
  int ret;
  test_curve *in_stack_00000098;
  test_curve *local_20;
  uint local_14;
  
  local_14 = 0;
  for (local_20 = test_curves; local_20->nid != 0; local_20 = local_20 + 1) {
    uVar1 = parameter_test(in_stack_00000098);
    local_14 = uVar1 | local_14;
  }
  if (local_14 == 0) {
    printf("\x1b[0;32m= All tests passed!\x1b[m\n");
  }
  else {
    printf("\x1b[0;31m= Some tests FAILED!\x1b[m\n");
  }
  return local_14;
}

Assistant:

int main(int argc, char **argv)
{
    int ret = 0;

    struct test_curve *tc;
    for (tc = test_curves; tc->nid; tc++) {
	ret |= parameter_test(tc);
    }

    if (ret)
	printf(cDRED "= Some tests FAILED!" cNORM "\n");
    else
	printf(cDGREEN "= All tests passed!" cNORM "\n");
    return ret;
}